

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O2

int skynet_mq_pop(message_queue *q,skynet_message *message)

{
  skynet_message *psVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  
  spinlock_lock(&q->lock);
  iVar3 = q->head;
  if (iVar3 == q->tail) {
    q->overload_threshold = 0x400;
    q->in_global = 0;
    iVar3 = 1;
  }
  else {
    psVar1 = q->queue;
    q->head = iVar3 + 1;
    message->sz = psVar1[iVar3].sz;
    psVar1 = psVar1 + iVar3;
    iVar3 = psVar1->session;
    pvVar2 = psVar1->data;
    message->source = psVar1->source;
    message->session = iVar3;
    message->data = pvVar2;
    iVar3 = q->head;
    if (q->cap <= iVar3) {
      q->head = 0;
      iVar3 = 0;
    }
    iVar3 = q->tail - iVar3;
    iVar3 = (iVar3 >> 0x1f & q->cap) + iVar3;
    iVar4 = q->overload_threshold;
    while (iVar4 < iVar3) {
      q->overload = iVar3;
      iVar4 = iVar4 * 2;
      q->overload_threshold = iVar4;
    }
    iVar3 = 0;
  }
  (q->lock).lock = 0;
  return iVar3;
}

Assistant:

int
skynet_mq_pop(struct message_queue *q, struct skynet_message *message) {
	int ret = 1;
	SPIN_LOCK(q)

	if (q->head != q->tail) {
		*message = q->queue[q->head++];
		ret = 0;
		int head = q->head;
		int tail = q->tail;
		int cap = q->cap;

		if (head >= cap) {
			q->head = head = 0;
		}
		int length = tail - head;
		if (length < 0) {
			length += cap;
		}
		while (length > q->overload_threshold) {
			q->overload = length;
			q->overload_threshold *= 2;
		}
	} else {
		// reset overload_threshold when queue is empty
		q->overload_threshold = MQ_OVERLOAD;
	}

	if (ret) {
		q->in_global = 0;
	}
	
	SPIN_UNLOCK(q)

	return ret;
}